

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void __thiscall
duckdb_parquet::ColumnCryptoMetaData::ColumnCryptoMetaData(ColumnCryptoMetaData *this)

{
  _EncryptionWithColumnKey__isset *p_Var1;
  
  *(undefined ***)this = &PTR__ColumnCryptoMetaData_0247de48;
  this->ENCRYPTION_WITH_FOOTER_KEY = (EncryptionWithFooterKey)&PTR__EncryptionWithFooterKey_0247dd78
  ;
  *(undefined ***)&this->ENCRYPTION_WITH_COLUMN_KEY = &PTR__EncryptionWithColumnKey_0247dde0;
  (this->ENCRYPTION_WITH_COLUMN_KEY).path_in_schema.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ENCRYPTION_WITH_COLUMN_KEY).path_in_schema.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ENCRYPTION_WITH_COLUMN_KEY).path_in_schema.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ENCRYPTION_WITH_COLUMN_KEY).key_metadata._M_dataplus._M_p =
       (pointer)&(this->ENCRYPTION_WITH_COLUMN_KEY).key_metadata.field_2;
  (this->ENCRYPTION_WITH_COLUMN_KEY).key_metadata._M_string_length = 0;
  (this->ENCRYPTION_WITH_COLUMN_KEY).key_metadata.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->ENCRYPTION_WITH_COLUMN_KEY).__isset;
  *p_Var1 = (_EncryptionWithColumnKey__isset)((byte)*p_Var1 & 0xfe);
  this->__isset = (_ColumnCryptoMetaData__isset)((byte)this->__isset & 0xfc);
  return;
}

Assistant:

ColumnCryptoMetaData::ColumnCryptoMetaData() noexcept {
}